

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insyde_fdm.cpp
# Opt level: O3

void __thiscall insyde_fdm_t::~insyde_fdm_t(insyde_fdm_t *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  kstream *pkVar2;
  pointer pcVar3;
  fdm_entries_t *pfVar4;
  fdm_board_ids_t *pfVar5;
  fdm_extensions_t *pfVar6;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__insyde_fdm_t_002b1dd0;
  pkVar2 = (this->m__io__raw_entries)._M_t.
           super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
           super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
           super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl;
  if (pkVar2 != (kstream *)0x0) {
    std::default_delete<kaitai::kstream>::operator()
              ((default_delete<kaitai::kstream> *)&this->m__io__raw_entries,pkVar2);
  }
  (this->m__io__raw_entries)._M_t.
  super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
  super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
  super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl = (kstream *)0x0;
  pcVar3 = (this->m__raw_entries)._M_dataplus._M_p;
  paVar1 = &(this->m__raw_entries).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pkVar2 = (this->m__io__raw_extensions)._M_t.
           super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
           super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
           super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl;
  if (pkVar2 != (kstream *)0x0) {
    std::default_delete<kaitai::kstream>::operator()
              ((default_delete<kaitai::kstream> *)&this->m__io__raw_extensions,pkVar2);
  }
  (this->m__io__raw_extensions)._M_t.
  super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
  super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
  super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl = (kstream *)0x0;
  pcVar3 = (this->m__raw_extensions)._M_dataplus._M_p;
  paVar1 = &(this->m__raw_extensions).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pfVar4 = (this->m_entries)._M_t.
           super___uniq_ptr_impl<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_insyde_fdm_t::fdm_entries_t_*,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
           .super__Head_base<0UL,_insyde_fdm_t::fdm_entries_t_*,_false>._M_head_impl;
  if (pfVar4 != (fdm_entries_t *)0x0) {
    (**(code **)((long)(pfVar4->super_kstruct)._vptr_kstruct + 8))();
  }
  (this->m_entries)._M_t.
  super___uniq_ptr_impl<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_insyde_fdm_t::fdm_entries_t_*,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
  .super__Head_base<0UL,_insyde_fdm_t::fdm_entries_t_*,_false>._M_head_impl = (fdm_entries_t *)0x0;
  pfVar5 = (this->m_board_ids)._M_t.
           super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
           .super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>._M_head_impl;
  if (pfVar5 != (fdm_board_ids_t *)0x0) {
    (**(code **)((long)(pfVar5->super_kstruct)._vptr_kstruct + 8))();
  }
  (this->m_board_ids)._M_t.
  super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
  .super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>._M_head_impl =
       (fdm_board_ids_t *)0x0;
  pfVar6 = (this->m_extensions)._M_t.
           super___uniq_ptr_impl<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
           .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>._M_head_impl;
  if (pfVar6 != (fdm_extensions_t *)0x0) {
    (**(code **)((long)(pfVar6->super_kstruct)._vptr_kstruct + 8))();
  }
  (this->m_extensions)._M_t.
  super___uniq_ptr_impl<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
  .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>._M_head_impl =
       (fdm_extensions_t *)0x0;
  return;
}

Assistant:

insyde_fdm_t::~insyde_fdm_t() {
    _clean_up();
}